

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::shareAssignmentAcrossSuccessors
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block)

{
  StringTmp<512UL> *this_00;
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  BaseRAPass *pBVar5;
  Error EVar6;
  char *str;
  uint extraout_EDX;
  undefined1 *puVar7;
  long lVar8;
  ulong uVar9;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *node;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *successor;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this_01;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar10;
  long lVar11;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar12;
  uint32_t sharedAssignmentId;
  uint32_t local_34;
  
  uVar1 = *(uint *)(block + 0x70);
  if (1 < (ulong)uVar1) {
    plVar3 = *(long **)(block + 0x68);
    if (((byte)block[0xd] & 2) == 0) {
      lVar11 = 0;
    }
    else {
      lVar11 = *plVar3;
    }
    local_34 = 0xffffffff;
    lVar8 = 0;
    this_01 = this;
    do {
      node = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)0xffffffff;
      lVar4 = *(long *)((long)plVar3 + lVar8);
      uVar2 = local_34;
      if (lVar4 != lVar11) {
        uVar2 = *(uint *)(lVar4 + 0xb8);
        str = (char *)(ulong)uVar2;
        if (str == (char *)0xffffffff) {
          if ((local_34 == 0xffffffff) &&
             (this_01 = this, EVar6 = newSharedAssignmentId(this,&local_34), EVar6 != 0)) {
            return EVar6;
          }
          *(uint32_t *)(lVar4 + 0xb8) = local_34;
          uVar2 = local_34;
        }
        else if (local_34 != 0xffffffff) {
          if (*(uint *)&this->field_0x38 <= uVar2) {
            shareAssignmentAcrossSuccessors();
            pBVar5 = this_01->_pass;
            uVar1 = *(uint *)&pBVar5->field_0xb8;
            if (((ulong)node->_cc & 0x20000000000) == 0) {
              pRVar12 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)0x0;
            }
            else {
              if (*(int *)&node->field_0x70 == 0) goto LAB_0014a364;
              pRVar12 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)
                        **(undefined8 **)&node->_sb;
            }
            if (1 < uVar1) {
              uVar9 = 1;
              successor = node;
              pRVar10 = this_01;
              do {
                if (*(uint *)&pBVar5->field_0xb8 <= uVar9) {
                  handleBlockWithUnknownJump();
                  node = successor;
                  this_01 = pRVar10;
LAB_0014a364:
                  handleBlockWithUnknownJump();
                  this_00 = &this_01->_sb;
                  String::clear((String *)this_00);
                  String::_opChars((String *)this_00,kAppend,' ',(ulong)extraout_EDX);
                  if (str != (char *)0x0) {
                    String::_opString((String *)this_00,kAppend,str,0xffffffffffffffff);
                    String::_opChar((String *)this_00,kAppend,' ');
                  }
                  Formatter::formatNode
                            ((String *)this_00,&this_01->_formatOptions,
                             &this_01->_cc->super_BaseBuilder,(BaseNode *)node);
                  String::_opChar((String *)this_00,kAppend,'\n');
                  uVar9 = (ulong)(byte)this_01->_sb;
                  if (uVar9 < 0x1f) {
                    puVar7 = &this_01->field_0x69;
                  }
                  else {
                    uVar9 = *(ulong *)&this_01->field_0x70;
                    puVar7 = *(undefined1 **)&this_01->field_0x80;
                  }
                  EVar6 = (*this_01->_logger->_vptr_Logger[2])(this_01->_logger,puVar7,uVar9);
                  return EVar6;
                }
                successor = *(RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> **)
                             (*(long *)&pBVar5->_blocks + uVar9 * 8);
                if ((successor != pRVar12) && (((ulong)successor->_cc & 0x400000000) != 0)) {
                  pRVar10 = node;
                  RABlock::appendSuccessor((RABlock *)node,(RABlock *)successor);
                }
                uVar9 = uVar9 + 1;
              } while (uVar1 != uVar9);
            }
            EVar6 = shareAssignmentAcrossSuccessors(this_01,(RABlock *)node);
            return EVar6;
          }
          *(uint32_t *)(*(long *)&this->_sharedAssignmentsMap + (long)str * 4) = local_34;
          uVar2 = local_34;
        }
      }
      local_34 = uVar2;
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar1 << 3 != lVar8);
  }
  return 0;
}

Assistant:

Error shareAssignmentAcrossSuccessors(RABlock* block) noexcept {
    if (block->successors().size() <= 1)
      return kErrorOk;

    RABlock* consecutive = block->consecutive();
    uint32_t sharedAssignmentId = Globals::kInvalidId;

    for (RABlock* successor : block->successors()) {
      if (successor == consecutive)
        continue;

      if (successor->hasSharedAssignmentId()) {
        if (sharedAssignmentId == Globals::kInvalidId)
          sharedAssignmentId = successor->sharedAssignmentId();
        else
          _sharedAssignmentsMap[successor->sharedAssignmentId()] = sharedAssignmentId;
      }
      else {
        if (sharedAssignmentId == Globals::kInvalidId)
          ASMJIT_PROPAGATE(newSharedAssignmentId(&sharedAssignmentId));
        successor->setSharedAssignmentId(sharedAssignmentId);
      }
    }
    return kErrorOk;
  }